

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

char * __thiscall CLIParser::next_string(CLIParser *this)

{
  char *pcVar1;
  runtime_error *this_00;
  
  if (this->argc != 0) {
    pcVar1 = *this->argv;
    this->argc = this->argc + -1;
    this->argv = this->argv + 1;
    return pcVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Tried to parse string, but nothing left in arguments");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const char *next_string()
	{
		if (!argc)
		{
			THROW("Tried to parse string, but nothing left in arguments");
		}

		const char *ret = *argv;
		argc--;
		argv++;
		return ret;
	}